

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParsePre(TidyDocImpl *doc,Node *pre,GetTokenMode mode)

{
  int iVar1;
  TidyParserMemory *pTVar2;
  Dict *pDVar3;
  Bool BVar4;
  long lVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node **ppNVar8;
  TidyTagId TVar9;
  int iVar10;
  Node *pNVar11;
  undefined8 uStack_40;
  
  if (pre == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    lVar5 = (long)iVar1;
    if (lVar5 < 0) {
      pre = (Node *)0x0;
      pNVar11 = (Node *)0x0;
      iVar10 = 0;
    }
    else {
      pTVar2 = (doc->stack).content;
      pre = pTVar2[lVar5].original_node;
      pNVar11 = pTVar2[lVar5].reentry_node;
      iVar10 = pTVar2[lVar5].reentry_state;
      (doc->stack).top = iVar1 + -1;
    }
  }
  else {
    pNVar11 = (Node *)0x0;
    iVar10 = 0;
    if ((pre->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  prvTidyInlineDup(doc,(Node *)0x0);
LAB_0013c5ef:
  do {
    do {
      while (iVar10 != 0) {
        if (iVar10 == 1) {
          pNVar6 = prvTidyInferredTag(doc,TidyTag_PRE);
          prvTidyReport(doc,pre,pNVar6,0x247);
          pNVar7 = pNVar11->parent;
          pNVar6->parent = pNVar7;
          if ((pNVar7 == (Node *)0x0) || (pNVar7->last != pNVar11)) {
            pNVar7 = pNVar11->next;
            pNVar6->next = pNVar7;
            if (pNVar7 != (Node *)0x0) {
              ppNVar8 = &pNVar7->prev;
              goto LAB_0013c691;
            }
          }
          else {
            ppNVar8 = &pNVar7->last;
LAB_0013c691:
            *ppNVar8 = pNVar6;
          }
          pNVar11->next = pNVar6;
          pNVar6->prev = pNVar11;
          iVar10 = 0;
          pre = pNVar6;
        }
        else if (iVar10 == 2) {
          prvTidyReport(doc,pre,pNVar11,0x25a);
          return (Node *)0x0;
        }
      }
      iVar10 = 2;
      pNVar7 = prvTidyGetToken(doc,Preformatted);
      pNVar11 = (Node *)0x0;
    } while (pNVar7 == (Node *)0x0);
    pNVar11 = pNVar7;
    if (pNVar7->type == EndTag) {
      pDVar3 = pNVar7->tag;
      if (pDVar3 != pre->tag) {
        if (pDVar3 == (Dict *)0x0) {
          TVar9 = TidyTag_UNKNOWN;
        }
        else {
          TVar9 = pDVar3->id;
        }
        for (pNVar6 = pre->parent; pNVar6 != (Node *)0x0; pNVar6 = pNVar6->parent) {
          if ((pNVar6->tag != (Dict *)0x0) && (pNVar6->tag->id == TVar9)) goto LAB_0013c7a5;
        }
        goto LAB_0013c6c7;
      }
LAB_0013c7a5:
      if ((pDVar3 == (Dict *)0x0) || ((pDVar3->id | TidyTag_DT) != TidyTag_HTML)) {
        if (pDVar3 == pre->tag) {
          prvTidyFreeNode(doc,pNVar7);
        }
        else {
          prvTidyReport(doc,pre,pNVar7,0x259);
          prvTidyUngetToken(doc);
        }
        pre->closed = yes;
        goto LAB_0013c8e9;
      }
      goto LAB_0013c7bc;
    }
LAB_0013c6c7:
    BVar4 = prvTidynodeIsText(pNVar7);
    if (BVar4 != no) {
      pNVar7->parent = pre;
      if (pre == (Node *)0x0) {
LAB_0013c7e3:
        pNVar7->prev = (Node *)0x0;
        pre = (Node *)0x0;
        iVar10 = 0;
      }
      else {
        pNVar6 = pre->last;
        ppNVar8 = &pNVar6->next;
        if (pNVar6 == (Node *)0x0) {
          ppNVar8 = &pre->content;
        }
        pNVar7->prev = pNVar6;
        *ppNVar8 = pNVar7;
        pre->last = pNVar7;
        iVar10 = 0;
      }
      goto LAB_0013c5ef;
    }
    BVar4 = InsertMisc(pre,pNVar7);
    iVar10 = 0;
    if (BVar4 == no) {
      if (pNVar7->tag != (Dict *)0x0) {
        if (pNVar7->tag->id == TidyTag_P) {
LAB_0013c72f:
          if (pNVar7->type == StartTag) {
            prvTidyReport(doc,pre,pNVar7,0x28e);
            TrimSpaces(doc,pre);
            prvTidyCoerceNode(doc,pNVar7,TidyTag_BR,no,no);
            prvTidyFreeAttrs(doc,pNVar7);
            pNVar7->parent = pre;
            if (pre == (Node *)0x0) goto LAB_0013c7e3;
            pNVar6 = pre->last;
            pNVar7->prev = pNVar6;
            ppNVar8 = &pNVar6->next;
            if (pNVar6 == (Node *)0x0) {
              ppNVar8 = &pre->content;
            }
            *ppNVar8 = pNVar7;
            pre->last = pNVar7;
            goto LAB_0013c5ef;
          }
        }
        else {
          BVar4 = prvTidynodeIsText(pNVar7);
          if ((BVar4 == no) &&
             (((pNVar7->tag == (Dict *)0x0 || (pNVar7->tag->id == TidyTag_PARAM)) ||
              (BVar4 = prvTidynodeHasCM(pNVar7,0x100010), BVar4 == no)))) {
            if (pNVar7->type != EndTag) {
              BVar4 = prvTidynodeHasCM(pNVar7,0x280);
              if ((BVar4 != no) ||
                 ((pNVar7->tag != (Dict *)0x0 && (pNVar7->tag->id == TidyTag_TABLE)))) {
                if (doc->lexer->exiled == no) {
                  prvTidyReport(doc,pre,pNVar7,0x259);
                }
                prvTidyUngetToken(doc);
                return (Node *)0x0;
              }
              pNVar11 = pre->parent;
              pNVar7->parent = pNVar11;
              if ((pNVar11 == (Node *)0x0) || (pNVar11->last != pre)) {
                pNVar11 = pre->next;
                pNVar7->next = pNVar11;
                if (pNVar11 != (Node *)0x0) {
                  ppNVar8 = &pNVar11->prev;
                  goto LAB_0013ca0b;
                }
              }
              else {
                ppNVar8 = &pNVar11->last;
LAB_0013ca0b:
                *ppNVar8 = pNVar7;
              }
              pre->next = pNVar7;
              pNVar7->prev = pre;
              prvTidyReport(doc,pre,pNVar7,0x259);
              uStack_40 = 0x100000000;
LAB_0013c9a7:
              prvTidypushMemory(doc,(TidyParserMemory)
                                    ZEXT3248(CONCAT824(uStack_40,
                                                       CONCAT816(pNVar7,CONCAT88(pre,prvTidyParsePre
                                                                                )))));
              return pNVar7;
            }
            if ((doc->lexer->exiled != no) &&
               ((BVar4 = prvTidynodeHasCM(pNVar7,0x80), BVar4 != no ||
                ((pNVar7->tag != (Dict *)0x0 && (pNVar7->tag->id == TidyTag_TABLE)))))) {
              prvTidyUngetToken(doc);
LAB_0013c8e9:
              TrimSpaces(doc,pre);
              return (Node *)0x0;
            }
          }
          else {
            if ((pNVar7->tag != (Dict *)0x0) && (pNVar7->tag->id == TidyTag_P)) goto LAB_0013c72f;
            BVar4 = prvTidynodeIsElement(pNVar7);
            if (BVar4 != no) {
              if ((pNVar7->tag != (Dict *)0x0) && (pNVar7->tag->id == TidyTag_BR)) {
                TrimSpaces(doc,pre);
              }
              pNVar7->parent = pre;
              if (pre == (Node *)0x0) {
                pNVar7->prev = (Node *)0x0;
              }
              else {
                pNVar11 = pre->last;
                pNVar7->prev = pNVar11;
                ppNVar8 = &pNVar11->next;
                if (pNVar11 == (Node *)0x0) {
                  ppNVar8 = &pre->content;
                }
                *ppNVar8 = pNVar7;
                pre->last = pNVar7;
              }
              uStack_40 = 0;
              goto LAB_0013c9a7;
            }
          }
        }
      }
LAB_0013c7bc:
      iVar10 = 0;
      prvTidyReport(doc,pre,pNVar7,0x235);
      prvTidyFreeNode(doc,pNVar7);
    }
  } while( true );
}

Assistant:

Node* TY_(ParsePre)( TidyDocImpl* doc, Node *pre, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_RENTRY_ACTION,          /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;


    if ( pre == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        pre = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(pre);
        if (pre->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }

    TY_(InlineDup)( doc, NULL ); /* tell lexer to insert inlines if needed */

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)(doc, Preformatted);
        
        switch ( state )
        {
            case STATE_INITIAL:
            {
                if ( node == NULL )
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if ( node->type == EndTag &&
                     (node->tag == pre->tag || DescendantOf(pre, TagId(node))) )
                {
                    if (nodeIsBODY(node) || nodeIsHTML(node))
                    {
                        TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)(doc, node);
                        continue;
                    }
                    if (node->tag == pre->tag)
                    {
                        TY_(FreeNode)(doc, node);
                    }
                    else
                    {
                        TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE );
                        TY_(UngetToken)( doc );
                    }
                    pre->closed = yes;
                    TrimSpaces(doc, pre);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if (TY_(nodeIsText)(node))
                {
                    TY_(InsertNodeAtEnd)(pre, node);
                    continue;
                }

                /* deal with comments etc. */
                if (InsertMisc(pre, node))
                    continue;

                if (node->tag == NULL)
                {
                    TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)(doc, node);
                    continue;
                }

                /* strip unexpected tags */
                if ( !PreContent(doc, node) )
                {
                    /* fix for http://tidy.sf.net/bug/772205 */
                    if (node->type == EndTag)
                    {
                        /* http://tidy.sf.net/issue/1590220 */
                       if ( doc->lexer->exiled
                           && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                       {
                          TY_(UngetToken)(doc);
                          TrimSpaces(doc, pre);
                           DEBUG_LOG_EXIT;
                          return NULL;
                       }

                       TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                       TY_(FreeNode)(doc, node);
                       continue;
                    }
                    /* http://tidy.sf.net/issue/1590220 */
                    else if (TY_(nodeHasCM)(node, CM_TABLE|CM_ROW)
                             || nodeIsTABLE(node) )
                    {
                        if (!doc->lexer->exiled)
                            /* No missing close warning if exiled. */
                            TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);

                        TY_(UngetToken)(doc);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /*
                      This is basically what Tidy 04 August 2000 did and far more accurate
                      with respect to browser behaivour than the code commented out above.
                      Tidy could try to propagate the <pre> into each disallowed child where
                      <pre> is allowed in order to replicate some browsers behaivour, but
                      there are a lot of exceptions, e.g. Internet Explorer does not propagate
                      <pre> into table cells while Mozilla does. Opera 6 never propagates
                      <pre> into blocklevel elements while Opera 7 behaves much like Mozilla.

                      Tidy behaves thus mostly like Opera 6 except for nested <pre> elements
                      which are handled like Mozilla takes them (Opera6 closes all <pre> after
                      the first </pre>).

                      There are similar issues like replacing <p> in <pre> with <br>, for
                      example

                        <pre>...<p>...</pre>                 (Input)
                        <pre>...<br>...</pre>                (Tidy)
                        <pre>...<br>...</pre>                (Opera 7 and Internet Explorer)
                        <pre>...<br><br>...</pre>            (Opera 6 and Mozilla)

                        <pre>...<p>...</p>...</pre>          (Input)
                        <pre>...<br>......</pre>             (Tidy, BUG!)
                        <pre>...<br>...<br>...</pre>         (Internet Explorer)
                        <pre>...<br><br>...<br><br>...</pre> (Mozilla, Opera 6)
                        <pre>...<br>...<br><br>...</pre>     (Opera 7)

                      or something similar, they could also be closing the <pre> and propagate
                      the <pre> into the newly opened <p>.

                      Todo: IMG, OBJECT, APPLET, BIG, SMALL, SUB, SUP, FONT, and BASEFONT are
                      disallowed in <pre>, Tidy neither detects this nor does it perform any
                      cleanup operation. Tidy should at least issue a warning if it encounters
                      such constructs.

                      Todo: discarding </p> is abviously a bug, it should be replaced by <br>.
                    */
                    TY_(InsertNodeAfterElement)(pre, node);
                    TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);
                    
                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParsePre);
                        memory.original_node = pre;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_RENTRY_ACTION;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                if ( nodeIsP(node) )
                {
                    if (node->type == StartTag)
                    {
                        TY_(Report)(doc, pre, node, USING_BR_INPLACE_OF);

                        /* trim white space before <p> in <pre>*/
                        TrimSpaces(doc, pre);

                        /* coerce both <p> and </p> to <br> */
                        TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                        TY_(FreeAttrs)( doc, node ); /* discard align attribute etc. */
                        TY_(InsertNodeAtEnd)( pre, node );
                    }
                    else
                    {
                        TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                    }
                    continue;
                }

                if ( TY_(nodeIsElement)(node) )
                {
                    /* trim white space before <br> */
                    if ( nodeIsBR(node) )
                        TrimSpaces(doc, pre);

                    TY_(InsertNodeAtEnd)(pre, node);
                    
                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParsePre);
                        memory.original_node = pre;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_INITIAL;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                /* discard unexpected tags */
                TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            } break;
                
            case STATE_RENTRY_ACTION:
            {
                Node* newnode = TY_(InferredTag)(doc, TidyTag_PRE);
                TY_(Report)(doc, pre, newnode, INSERTING_TAG);
                pre = newnode;
                TY_(InsertNodeAfterElement)(node, pre);
                state = STATE_INITIAL;
                continue;
            } break;
            
            default:
                break;

        } /* switch */
    } /* while */

    TY_(Report)(doc, pre, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}